

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditPrivate::textEdited(QLineEditPrivate *this,QString *text)

{
  QLineEdit *this_00;
  QWidgetLineControl *pQVar1;
  Data *pDVar2;
  CompletionMode CVar3;
  
  this_00 = *(QLineEdit **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x27c = this->field_0x27c | 0x20;
  QLineEdit::textEdited(this_00,text);
  pQVar1 = this->control;
  pDVar2 = (pQVar1->m_completer).wp.d;
  if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
     ((pQVar1->m_completer).wp.value != (QObject *)0x0)) {
    CVar3 = QCompleter::completionMode((QCompleter *)(pQVar1->m_completer).wp.value);
    if (CVar3 != InlineCompletion) {
      QWidgetLineControl::complete((QWidgetLineControl *)this->control,-1);
      return;
    }
  }
  return;
}

Assistant:

void QLineEditPrivate::textEdited(const QString &text)
{
    Q_Q(QLineEdit);
    edited = true;
    emit q->textEdited(text);
#if QT_CONFIG(completer)
    if (control->completer()
        && control->completer()->completionMode() != QCompleter::InlineCompletion)
        control->complete(-1); // update the popup on cut/paste/del
#endif
}